

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O3

char * __thiscall
MeCab::anon_unknown_0::TaggerImpl::parseNBest(TaggerImpl *this,size_t N,char *str,size_t len)

{
  Lattice *pLVar1;
  char *pcVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  _func_int **pp_Var5;
  Lattice *pLVar4;
  
  pLVar4 = (this->lattice_).ptr_;
  if (pLVar4 == (Lattice *)0x0) {
    iVar3 = (*(this->current_model_->super_Model)._vptr_Model[4])();
    pLVar4 = (Lattice *)CONCAT44(extraout_var,iVar3);
    pLVar1 = (this->lattice_).ptr_;
    if (pLVar1 != (Lattice *)0x0) {
      (*pLVar1->_vptr_Lattice[0x27])();
    }
    (this->lattice_).ptr_ = pLVar4;
  }
  (*pLVar4->_vptr_Lattice[10])(pLVar4,str,len);
  initRequestType(this);
  (*pLVar4->_vptr_Lattice[0x14])(pLVar4,2);
  iVar3 = (**(this->super_Tagger)._vptr_Tagger)(this);
  pp_Var5 = pLVar4->_vptr_Lattice;
  if ((char)iVar3 != '\0') {
    iVar3 = (*pp_Var5[0x1a])(pLVar4);
    if ((char *)CONCAT44(extraout_var_00,iVar3) != (char *)0x0) {
      return (char *)CONCAT44(extraout_var_00,iVar3);
    }
    pp_Var5 = pLVar4->_vptr_Lattice;
  }
  iVar3 = (*pp_Var5[0x24])(pLVar4);
  pcVar2 = (char *)(this->what_)._M_string_length;
  strlen((char *)CONCAT44(extraout_var_01,iVar3));
  std::__cxx11::string::_M_replace((ulong)&this->what_,0,pcVar2,CONCAT44(extraout_var_01,iVar3));
  return (char *)0x0;
}

Assistant:

const char* TaggerImpl::parseNBest(size_t N,
                                   const char* str, size_t len) {
  Lattice *lattice = mutable_lattice();
  lattice->set_sentence(str, len);
  initRequestType();
  lattice->add_request_type(MECAB_NBEST);

  if (!parse(lattice)) {
    set_what(lattice->what());
    return 0;
  }

  const char *result = lattice->enumNBestAsString(N);
  if (!result) {
    set_what(lattice->what());
    return 0;
  }
  return result;
}